

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpile_to_js.c
# Opt level: O3

void to_js_print_conditional_expression_tree
               (FILE *out,AST_Conditional_Expression *cond,Program *program)

{
  fputc(0x28,(FILE *)out);
  to_js_print_ast(out,cond->left,program);
  fputc(0x3f,(FILE *)out);
  to_js_print_ast(out,cond->center,program);
  fputc(0x3a,(FILE *)out);
  to_js_print_ast(out,cond->right,program);
  fputc(0x29,(FILE *)out);
  return;
}

Assistant:

void to_js_print_conditional_expression_tree(FILE* out,struct AST_Conditional_Expression *cond,struct Program *program)
{
	fprintf(out,"(");
	to_js_print_ast(out,cond->left,program);
	fprintf(out,"?");
	to_js_print_ast(out,cond->center,program);
	fprintf(out,":");
	to_js_print_ast(out,cond->right,program);
	fprintf(out,")");
}